

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  pointer pAVar1;
  ConfigData *pCVar2;
  const_reference pvVar3;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDX;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RSI;
  value_type *in_RDI;
  Token *token;
  size_t i;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *unusedTokens;
  ConfigData *config_00;
  value_type *__x;
  ConfigData *local_30;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  
  __x = in_RDI;
  this_00 = in_RSI;
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                  *)in_RDI);
  if (pAVar1 == (pointer)0x0) {
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
              (this_00,in_RDX);
  }
  else {
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
              ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
               0x1d66d1);
    local_30 = (ConfigData *)0x0;
    while (config_00 = local_30,
          pCVar2 = (ConfigData *)
                   std::
                   vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                   ::size(in_RDX), config_00 < pCVar2) {
      pvVar3 = std::
               vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
               operator[](in_RDX,(size_type)local_30);
      if (pvVar3->type == Positional) {
        std::
        unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ::operator->((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                      *)0x1d6729);
        Detail::BoundArgFunction<Catch::ConfigData>::set
                  ((BoundArgFunction<Catch::ConfigData> *)in_RDI,config_00,(string *)0x1d673f);
      }
      else {
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        push_back(in_RSI,__x);
      }
      local_30 = (ConfigData *)&local_30->listTags;
    }
  }
  return (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)__x;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( !m_floatingArg.get() )
                return tokens;
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                if( token.type == Parser::Token::Positional )
                    m_floatingArg->boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }